

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list.hpp
# Opt level: O1

void __thiscall
pstore::broker::intrusive_list<(anonymous_namespace)::value>::insert_before
          (intrusive_list<(anonymous_namespace)::value> *this,value *element,value *before)

{
  (element->list_memb).prev = (before->list_memb).prev;
  (((before->list_memb).prev)->list_memb).next = element;
  (before->list_memb).prev = element;
  (element->list_memb).next = before;
  if ((((element->list_memb).prev)->list_memb).next == element) {
    check(this);
    return;
  }
  assert_failed("element_member.prev->get_list_member ().next == element",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/intrusive_list.hpp"
                ,0x8a);
}

Assistant:

void intrusive_list<T>::insert_before (T * element, T * before) noexcept {
            auto & element_member = element->get_list_member ();
            auto & before_member = before->get_list_member ();

            element_member.prev = before_member.prev;
            before_member.prev->get_list_member ().next = element;
            before_member.prev = element;
            element_member.next = before;

            PSTORE_ASSERT (element_member.next->get_list_member ().prev == element);
            PSTORE_ASSERT (element_member.prev->get_list_member ().next == element);
            this->check ();
        }